

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

void __thiscall
duckdb::ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_>::ModeAdd
          (ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_> *this,idx_t row)

{
  unsigned_short *puVar1;
  mapped_type *pmVar2;
  __buckets_ptr pp_Var3;
  unsigned_long uVar4;
  unsigned_short *puVar5;
  unsigned_long in_RSI;
  unordered_map<unsigned_short,_duckdb::ModeAttr,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_duckdb::ModeAttr>_>_>
  *in_RDI;
  size_t new_count;
  mapped_type *attr;
  unsigned_short *key;
  key_type *in_stack_ffffffffffffffc8;
  idx_t in_stack_ffffffffffffffd8;
  ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_> *in_stack_ffffffffffffffe0;
  
  puVar1 = GetCell(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pmVar2 = std::
           unordered_map<unsigned_short,_duckdb::ModeAttr,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_duckdb::ModeAttr>_>_>
           ::operator[](in_RDI,in_stack_ffffffffffffffc8);
  pp_Var3 = (__buckets_ptr)(pmVar2->count + 1);
  pmVar2->count = (size_t)pp_Var3;
  if (pp_Var3 == (__buckets_ptr)0x1) {
    (in_RDI->_M_h)._M_rehash_policy._M_next_resize =
         (in_RDI->_M_h)._M_rehash_policy._M_next_resize + 1;
    pmVar2->first_row = in_RSI;
  }
  else {
    uVar4 = MinValue<unsigned_long>(in_RSI,pmVar2->first_row);
    pmVar2->first_row = uVar4;
  }
  if (in_RDI[1]._M_h._M_buckets < pp_Var3) {
    *(undefined1 *)&(in_RDI->_M_h)._M_single_bucket = 1;
    in_RDI[1]._M_h._M_buckets = pp_Var3;
    if (*(long *)&(in_RDI->_M_h)._M_rehash_policy == 0) {
      puVar5 = (unsigned_short *)operator_new(2);
      *puVar5 = *puVar1;
      *(unsigned_short **)&(in_RDI->_M_h)._M_rehash_policy = puVar5;
    }
    else {
      **(unsigned_short **)&(in_RDI->_M_h)._M_rehash_policy = *puVar1;
    }
  }
  return;
}

Assistant:

void ModeAdd(idx_t row) {
		const auto &key = GetCell(row);
		auto &attr = (*frequency_map)[key];
		auto new_count = (attr.count += 1);
		if (new_count == 1) {
			++nonzero;
			attr.first_row = row;
		} else {
			attr.first_row = MinValue(row, attr.first_row);
		}
		if (new_count > count) {
			valid = true;
			count = new_count;
			if (mode) {
				*mode = key;
			} else {
				mode = new KEY_TYPE(key);
			}
		}
	}